

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test::TestBody
          (TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test *this)

{
  pointer pcVar1;
  undefined8 *puVar2;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  StringLike<std::__cxx11::basic_string<char>_> *substring_00;
  StringLike<std::__cxx11::basic_string<char>_> *substring_01;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string serialized;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  long local_110;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [16];
  char local_f8 [8];
  undefined8 *local_f0;
  AssertHelper local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->super_TextSerializerTest).metric.histogram.sample_count = 2;
  (this->super_TextSerializerTest).metric.histogram.sample_sum = 32.0;
  (anonymous_namespace)::TextSerializerTest::Serialize_abi_cxx11_(&local_a8,this,Histogram);
  pcVar1 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,
             pcVar1 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  testing::HasSubstr<std::__cxx11::string>(&local_48,(testing *)local_c8,substring);
  local_118._M_head_impl = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_48.impl_.substring_._M_dataplus._M_p,
             local_48.impl_.substring_._M_dataplus._M_p + local_48.impl_.substring_._M_string_length
            );
  local_e8[0].data_ = (AssertHelperData *)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,local_118._M_head_impl,local_118._M_head_impl + local_110);
  if (local_118._M_head_impl != local_108) {
    operator_delete(local_118._M_head_impl);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_f8,(char *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_e8[0].data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.impl_.substring_._M_dataplus._M_p != &local_48.impl_.substring_.field_2) {
    operator_delete(local_48.impl_.substring_._M_dataplus._M_p);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (local_f8[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  puVar2 = local_f0;
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(puVar2);
  }
  pcVar1 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,
             pcVar1 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  testing::HasSubstr<std::__cxx11::string>(&local_68,(testing *)local_c8,substring_00);
  local_118._M_head_impl = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_68.impl_.substring_._M_dataplus._M_p,
             local_68.impl_.substring_._M_dataplus._M_p + local_68.impl_.substring_._M_string_length
            );
  local_e8[0].data_ = (AssertHelperData *)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,local_118._M_head_impl,local_118._M_head_impl + local_110);
  if (local_118._M_head_impl != local_108) {
    operator_delete(local_118._M_head_impl);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_f8,(char *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_e8[0].data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.impl_.substring_._M_dataplus._M_p != &local_68.impl_.substring_.field_2) {
    operator_delete(local_68.impl_.substring_._M_dataplus._M_p);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (local_f8[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  puVar2 = local_f0;
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(puVar2);
  }
  pcVar1 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,
             pcVar1 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  testing::HasSubstr<std::__cxx11::string>(&local_88,(testing *)local_c8,substring_01);
  local_118._M_head_impl = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_88.impl_.substring_._M_dataplus._M_p,
             local_88.impl_.substring_._M_dataplus._M_p + local_88.impl_.substring_._M_string_length
            );
  local_e8[0].data_ = (AssertHelperData *)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,local_118._M_head_impl,local_118._M_head_impl + local_110);
  if (local_118._M_head_impl != local_108) {
    operator_delete(local_118._M_head_impl);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_f8,(char *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_e8[0].data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.impl_.substring_._M_dataplus._M_p != &local_88.impl_.substring_.field_2) {
    operator_delete(local_88.impl_.substring_._M_dataplus._M_p);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (local_f8[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogramWithNoBuckets) {
  metric.histogram.sample_count = 2;
  metric.histogram.sample_sum = 32.0;

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 32\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2"));
}